

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O2

void regress(reg_object obj,double *x,double *y,double *res,double *varcovar,double alpha)

{
  size_t __size;
  uint p;
  uint uVar1;
  int iVar2;
  double *anv;
  double *ci_lower;
  double *ci_upper;
  double *sigma2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long local_60;
  double *local_48;
  
  p = obj->p;
  lVar5 = (long)(int)p;
  obj->alpha = alpha;
  anv = (double *)malloc(0x38);
  lVar4 = 0;
  if (lVar5 == 0) {
    local_60 = 0;
    local_48 = (double *)0x0;
  }
  else {
    local_48 = (double *)malloc(lVar5 * 8);
    local_60 = lVar5;
  }
  __size = lVar5 * 8 + 8;
  ci_lower = (double *)malloc(__size);
  ci_upper = (double *)malloc(__size);
  sigma2 = (double *)malloc(8);
  linreg_multi(p,x,y,obj->N,local_48,sigma2,varcovar,obj->R2,res,alpha,anv,ci_lower,ci_upper,
               &obj->rank,obj->lls,obj->intercept);
  obj->df = obj->N - obj->p;
  obj->sigma = *sigma2;
  obj->sigma_lower = ci_lower[local_60];
  obj->sigma_upper = ci_upper[local_60];
  obj->TSS = *anv;
  obj->ESS = anv[1];
  obj->RSS = anv[2];
  obj->df_ESS = (int)anv[3];
  obj->df_RSS = (int)anv[4];
  obj->FStat = anv[5];
  obj->PVal = anv[6];
  obj->r2 = obj->R2[0];
  obj->r2adj = obj->R2[1];
  uVar6 = 0;
  if (0 < (int)p) {
    uVar6 = (ulong)p;
  }
  for (; uVar6 * 8 != lVar4; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)&obj->beta[0].value + lVar4 * 4) = *(undefined8 *)((long)local_48 + lVar4)
    ;
    *(undefined8 *)((long)&obj->beta[0].lower + lVar4 * 4) = *(undefined8 *)((long)ci_lower + lVar4)
    ;
    *(undefined8 *)((long)&obj->beta[0].upper + lVar4 * 4) = *(undefined8 *)((long)ci_upper + lVar4)
    ;
    dVar7 = *varcovar;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    *(double *)((long)&obj->beta[0].stdErr + lVar4 * 4) = dVar7;
    varcovar = varcovar + lVar5 + 1;
  }
  uVar1 = obj->N;
  uVar6 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  dVar7 = 0.0;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    dVar7 = dVar7 + res[uVar6] * res[uVar6];
  }
  dVar9 = (double)(int)uVar1 * 0.5;
  dVar7 = log(dVar7 / (double)(int)uVar1);
  dVar9 = (dVar9 * -1.8378770664093453 - dVar7 * dVar9) - dVar9;
  obj->loglik = dVar9;
  iVar2 = obj->intercept;
  dVar7 = (double)(int)p;
  dVar9 = dVar9 * -2.0;
  obj->aic = dVar7 + dVar7 + dVar9;
  dVar8 = log((double)obj->N);
  obj->bic = dVar8 * dVar7 + dVar9;
  dVar7 = (double)(int)(p - (iVar2 == 1));
  obj->aicc = ((double)obj->N / (((double)obj->N - dVar7) + -1.0) + -1.0) * (dVar7 + dVar7) +
              obj->aic;
  free(anv);
  free(local_48);
  free(ci_upper);
  free(ci_lower);
  free(sigma2);
  return;
}

Assistant:

void regress(reg_object obj, double *x, double *y, double *res, double *varcovar, double alpha) {
	double *anv2, *b2, *low, *up, *sigma2;
	int p, i, p2, k, dfm;
	double ssr, N2, pi;
	/*
	* obj - Regression object created by reg_init
	*  x - Vector containing (p - 1 ) independent regression variables of length N each
	*  y - Vector containing dependent regression variable of length N
	*  res - Residual vector of length N
	* varcovar - Variance-Covariance Matrix of p regression parameters. Dimension p X p
	* alpha is used to determine confidence interval limits
	* for a given 100*(1-alpha) % confidence interval
	* eg., alpha = 0.05 if you want to determine 95% confidence interval values
	*/
	p = obj->p;
	obj->alpha = alpha;
	anv2 = (double*)malloc(sizeof(double) * 7);
	b2 = p == 0 ? NULL : (double*)malloc(sizeof(double) * p);
	low = (double*)malloc(sizeof(double) * (p + 1));
	up = (double*)malloc(sizeof(double) * (p + 1));
	sigma2 = (double*)malloc(sizeof(double) * 1);

	pi = 3.141592653589793;


	linreg_multi(p, x, y, obj->N, b2, sigma2, varcovar,
		obj->R2, res, alpha, anv2, low, up, &obj->rank, obj->lls, obj->intercept);
	obj->df = obj->N - obj->p;

	obj->sigma = sigma2[0];
	obj->sigma_lower = low[p];
	obj->sigma_upper = up[p];

	obj->TSS = anv2[0];
	obj->ESS = anv2[1];
	obj->RSS = anv2[2];
	obj->df_ESS = (int)anv2[3];
	obj->df_RSS = (int)anv2[4];
	obj->FStat = anv2[5];
	obj->PVal = anv2[6];
	obj->r2 = obj->R2[0];
	obj->r2adj = obj->R2[1];

	for (i = 0; i < p; ++i) {
		(obj->beta + i)->value = b2[i];
		(obj->beta + i)->lower = low[i];
		(obj->beta + i)->upper = up[i];
		(obj->beta + i)->stdErr = sqrt(varcovar[(p + 1)*i]);
	}

	// Log Likelihood

	N2 = (double)(obj->N) / 2.0;

	ssr = 0.0;

	for (i = 0; i < obj->N; ++i) {
		ssr += (res[i] * res[i]);
	}

	obj->loglik = -N2 * log(2 * pi) - N2 * log(ssr / (double)obj->N) - N2;

	k = obj->intercept == 1 ? 1 : 0;
	dfm = obj->intercept == 1 ? p - 1 : p;

	obj->aic = -2.0 * obj->loglik + 2.0 * (double)(k + dfm);
	obj->bic = -2.0 * obj->loglik + log((double)obj->N) * (double)(k + dfm);
	obj->aicc = obj->aic + 2.0 * dfm * ((double)obj->N / ((double)obj->N - dfm - 1.0) - 1.0);

	free(anv2);
	free(b2);
	free(up);
	free(low);
	free(sigma2);
}